

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::PRE::FindPossiblePRECandidates(PRE *this,Loop *loop,JitArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  undefined1 local_50 [8];
  Iterator __iter;
  PRECandidates *local_38;
  
  __iter.current = (NodeBase *)this;
  pBVar3 = Loop::GetHeadBlock(loop);
  local_50 = (undefined1  [8])&pBVar3->predList;
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_38 = (PRECandidates *)0x0;
  do {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_00446b28;
      *puVar4 = 0;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_50) {
      __iter.current[1].next = (Type)local_38;
      return;
    }
    ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_50);
    pBVar3 = (*ppFVar5)->predBlock;
    if (pBVar3 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3b2,"(blockPred)","blockPred");
      if (!bVar2) {
LAB_00446b28:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Loop::IsDescendentOrSelf(loop,pBVar3->loop);
    if (bVar2) {
      local_38 = FindBackEdgePRECandidates((GlobOpt *)(__iter.current)->next,pBVar3,alloc);
    }
  } while( true );
}

Assistant:

void GlobOpt::PRE::FindPossiblePRECandidates(Loop *loop, JitArenaAllocator *alloc)
{
    // Find the set of PRE candidates
    BasicBlock *loopHeader = loop->GetHeadBlock();
    PRECandidates *candidates = nullptr;
    bool firstBackEdge = true;

    FOREACH_PREDECESSOR_BLOCK(blockPred, loopHeader)
    {
        if (!loop->IsDescendentOrSelf(blockPred->loop))
        {
            // Not a loop back-edge
            continue;
        }
        if (firstBackEdge)
        {
            candidates = this->globOpt->FindBackEdgePRECandidates(blockPred, alloc);
        }
        else
        {
            blockPred->globOptData.RemoveUnavailableCandidates(candidates);
        }
    } NEXT_PREDECESSOR_BLOCK;

    this->candidates = candidates;
}